

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O3

void __thiscall
vector_bagwell<unsigned_long,_16U>::push_back
          (vector_bagwell<unsigned_long,_16U> *this,unsigned_long *t)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  
  if (this->_left_in_block == 0) {
    vector_bagwell<unsigned_long,16u>::push_back();
  }
  uVar1 = *t;
  puVar2 = this->_insertpos;
  this->_insertpos = puVar2 + 1;
  *puVar2 = uVar1;
  this->_left_in_block = this->_left_in_block - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(current_block_full(), false)) {
			_left_in_block = Initial << _index_block.size();
			_insertpos = static_cast<T*>(
					malloc(_left_in_block*sizeof(T)));
			_index_block.push_back(_insertpos);
		}
		*_insertpos++ = t;
		--_left_in_block;
	}